

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O0

void pybind11::detail::translate_exception(exception_ptr *p)

{
  bool bVar1;
  undefined8 uVar2;
  error_already_set *this;
  long *plVar3;
  undefined8 uVar4;
  int iVar5;
  undefined1 auVar6 [12];
  error_already_set *e;
  builtin_exception *e_1;
  bad_alloc *e_2;
  domain_error *e_3;
  invalid_argument *e_4;
  length_error *e_5;
  out_of_range *e_6;
  range_error *e_7;
  overflow_error *e_8;
  exception *e_9;
  exception_ptr local_18;
  exception_ptr *local_10;
  exception_ptr *p_local;
  
  local_10 = p;
  bVar1 = std::__exception_ptr::exception_ptr::operator_cast_to_bool(p);
  if (bVar1) {
    std::__exception_ptr::exception_ptr::exception_ptr(&local_18,p);
    auVar6 = std::rethrow_exception((exception_ptr)&local_18);
    iVar5 = auVar6._8_4_;
    uVar2 = auVar6._0_8_;
    std::__exception_ptr::exception_ptr::~exception_ptr(&local_18);
    if (iVar5 == 0xb) {
      this = (error_already_set *)__cxa_begin_catch(uVar2);
      error_already_set::restore(this);
      __cxa_end_catch();
    }
    else if (iVar5 == 10) {
      plVar3 = (long *)__cxa_begin_catch(uVar2);
      (**(code **)(*plVar3 + 0x18))();
      __cxa_end_catch();
    }
    else if (iVar5 == 9) {
      plVar3 = (long *)__cxa_begin_catch(uVar2);
      uVar2 = _PyExc_MemoryError;
      uVar4 = (**(code **)(*plVar3 + 0x10))();
      PyErr_SetString(uVar2,uVar4);
      __cxa_end_catch();
    }
    else if (iVar5 == 8) {
      plVar3 = (long *)__cxa_begin_catch(uVar2);
      uVar2 = _PyExc_ValueError;
      uVar4 = (**(code **)(*plVar3 + 0x10))();
      PyErr_SetString(uVar2,uVar4);
      __cxa_end_catch();
    }
    else if (iVar5 == 7) {
      plVar3 = (long *)__cxa_begin_catch(uVar2);
      uVar2 = _PyExc_ValueError;
      uVar4 = (**(code **)(*plVar3 + 0x10))();
      PyErr_SetString(uVar2,uVar4);
      __cxa_end_catch();
    }
    else if (iVar5 == 6) {
      plVar3 = (long *)__cxa_begin_catch(uVar2);
      uVar2 = _PyExc_ValueError;
      uVar4 = (**(code **)(*plVar3 + 0x10))();
      PyErr_SetString(uVar2,uVar4);
      __cxa_end_catch();
    }
    else if (iVar5 == 5) {
      plVar3 = (long *)__cxa_begin_catch(uVar2);
      uVar2 = _PyExc_IndexError;
      uVar4 = (**(code **)(*plVar3 + 0x10))();
      PyErr_SetString(uVar2,uVar4);
      __cxa_end_catch();
    }
    else if (iVar5 == 4) {
      plVar3 = (long *)__cxa_begin_catch(uVar2);
      uVar2 = _PyExc_ValueError;
      uVar4 = (**(code **)(*plVar3 + 0x10))();
      PyErr_SetString(uVar2,uVar4);
      __cxa_end_catch();
    }
    else if (iVar5 == 3) {
      plVar3 = (long *)__cxa_begin_catch(uVar2);
      uVar2 = _PyExc_OverflowError;
      uVar4 = (**(code **)(*plVar3 + 0x10))();
      PyErr_SetString(uVar2,uVar4);
      __cxa_end_catch();
    }
    else if (iVar5 == 2) {
      plVar3 = (long *)__cxa_begin_catch(uVar2);
      uVar2 = _PyExc_RuntimeError;
      uVar4 = (**(code **)(*plVar3 + 0x10))();
      PyErr_SetString(uVar2,uVar4);
      __cxa_end_catch();
    }
    else {
      __cxa_begin_catch(uVar2);
      PyErr_SetString(_PyExc_RuntimeError,"Caught an unknown exception!");
      __cxa_end_catch();
    }
  }
  return;
}

Assistant:

inline void translate_exception(std::exception_ptr p) {
    try {
        if (p) std::rethrow_exception(p);
    } catch (error_already_set &e)           { e.restore();                                    return;
    } catch (const builtin_exception &e)     { e.set_error();                                  return;
    } catch (const std::bad_alloc &e)        { PyErr_SetString(PyExc_MemoryError,   e.what()); return;
    } catch (const std::domain_error &e)     { PyErr_SetString(PyExc_ValueError,    e.what()); return;
    } catch (const std::invalid_argument &e) { PyErr_SetString(PyExc_ValueError,    e.what()); return;
    } catch (const std::length_error &e)     { PyErr_SetString(PyExc_ValueError,    e.what()); return;
    } catch (const std::out_of_range &e)     { PyErr_SetString(PyExc_IndexError,    e.what()); return;
    } catch (const std::range_error &e)      { PyErr_SetString(PyExc_ValueError,    e.what()); return;
    } catch (const std::overflow_error &e)   { PyErr_SetString(PyExc_OverflowError, e.what()); return;
    } catch (const std::exception &e)        { PyErr_SetString(PyExc_RuntimeError,  e.what()); return;
    } catch (...) {
        PyErr_SetString(PyExc_RuntimeError, "Caught an unknown exception!");
        return;
    }
}